

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlabKosorajo.c
# Opt level: O0

int checkerBig1(void)

{
  int iVar1;
  int local_30;
  int local_2c;
  int job;
  int i;
  int check_cnt;
  int N;
  char *fact;
  FILE *out;
  
  fact = (char *)fopen("out.txt","r");
  _check_cnt = "PASSED";
  if ((FILE *)fact == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    i = 2000;
    _check_cnt = ScanInt((FILE *)fact,&job);
    if (job == i) {
      local_2c = i;
      while( true ) {
        if ((local_2c < 1) || (_check_cnt = ScanInt((FILE *)fact,&local_30), _check_cnt == "FAILED")
           ) goto LAB_00102cd3;
        if (local_30 != local_2c) break;
        local_2c = local_2c + -1;
      }
      printf("wrong output -- ");
      _check_cnt = "FAILED";
    }
    else {
      printf("wrong output -- ");
      _check_cnt = "FAILED";
    }
LAB_00102cd3:
    if ((_check_cnt == "PASSED") && (iVar1 = HaveGarbageAtTheEnd((FILE *)fact), iVar1 != 0)) {
      _check_cnt = "FAILED";
    }
    fclose((FILE *)fact);
    printf("%s\n",_check_cnt);
    out._4_4_ = (uint)(_check_cnt == "FAILED");
  }
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");

    const char *fact = Pass;

    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }

    { // test order
        int N = N_MAX, check_cnt;
        fact = ScanInt(out, &check_cnt);

        if (check_cnt != N)
        {
            printf("wrong output -- ");
            fact = Fail;
        }
        else
        {
            for (int i = N; i > 0; i--) {

                int job;
                fact = ScanInt(out, &job);

                if (fact == Fail)
                    break;

                if (job != i) {
                    printf("wrong output -- ");
                    fact = Fail;
                    break;
                }
            }
        }
    }

    if (fact == Pass && HaveGarbageAtTheEnd(out))
        fact = Fail;

    fclose(out);
    
    printf("%s\n", fact);

    testN++;

    return fact == Fail;
}